

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O0

mz_bool mz_zip_writer_init_file_v2
                  (mz_zip_archive *pZip,char *pFilename,mz_uint64 size_to_reserve_at_beginning,
                  mz_uint flags)

{
  mz_bool mVar1;
  FILE *pFVar2;
  size_t sVar3;
  char *__modes;
  size_t local_1068;
  size_t n;
  char buf [4096];
  mz_uint64 cur_ofs;
  FILE *pFile;
  mz_uint64 mStack_40;
  mz_uint flags_local;
  mz_uint64 size_to_reserve_at_beginning_local;
  char *pFilename_local;
  mz_zip_archive *pZip_local;
  
  pZip->m_pWrite = mz_zip_file_write_func;
  pZip->m_pNeeds_keepalive = (mz_file_needs_keepalive)0x0;
  if ((flags & 0x8000) != 0) {
    pZip->m_pRead = mz_zip_file_read_func;
  }
  pZip->m_pIO_opaque = pZip;
  mVar1 = mz_zip_writer_init_v2(pZip,size_to_reserve_at_beginning,flags);
  if (mVar1 == 0) {
    pZip_local._0_4_ = 0;
  }
  else {
    __modes = "wb";
    if ((flags & 0x8000) != 0) {
      __modes = "w+b";
    }
    pFVar2 = fopen(pFilename,__modes);
    if (pFVar2 == (FILE *)0x0) {
      mz_zip_writer_end(pZip);
      if (pZip != (mz_zip_archive *)0x0) {
        pZip->m_last_error = MZ_ZIP_FILE_OPEN_FAILED;
      }
      pZip_local._0_4_ = 0;
    }
    else {
      pZip->m_pState->m_pFile = (FILE *)pFVar2;
      pZip->m_zip_type = MZ_ZIP_TYPE_FILE;
      if (size_to_reserve_at_beginning != 0) {
        buf[0xff8] = '\0';
        buf[0xff9] = '\0';
        buf[0xffa] = '\0';
        buf[0xffb] = '\0';
        buf[0xffc] = '\0';
        buf[0xffd] = '\0';
        buf[0xffe] = '\0';
        buf[0xfff] = '\0';
        memset(&n,0,0x1000);
        mStack_40 = size_to_reserve_at_beginning;
        do {
          if (mStack_40 < 0x1001) {
            local_1068 = mStack_40;
          }
          else {
            local_1068 = 0x1000;
          }
          sVar3 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,buf._4088_8_,&n,local_1068);
          if (sVar3 != local_1068) {
            mz_zip_writer_end(pZip);
            if (pZip != (mz_zip_archive *)0x0) {
              pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
            }
            return 0;
          }
          buf._4088_8_ = local_1068 + buf._4088_8_;
          mStack_40 = mStack_40 - local_1068;
        } while (mStack_40 != 0);
      }
      pZip_local._0_4_ = 1;
    }
  }
  return (mz_bool)pZip_local;
}

Assistant:

mz_bool mz_zip_writer_init_file_v2(mz_zip_archive *pZip, const char *pFilename, mz_uint64 size_to_reserve_at_beginning, mz_uint flags)
{
    MZ_FILE *pFile;

    pZip->m_pWrite = mz_zip_file_write_func;
    pZip->m_pNeeds_keepalive = NULL;

    if (flags & MZ_ZIP_FLAG_WRITE_ALLOW_READING)
        pZip->m_pRead = mz_zip_file_read_func;

    pZip->m_pIO_opaque = pZip;

    if (!mz_zip_writer_init_v2(pZip, size_to_reserve_at_beginning, flags))
        return MZ_FALSE;

    if (NULL == (pFile = MZ_FOPEN(pFilename, (flags & MZ_ZIP_FLAG_WRITE_ALLOW_READING) ? "w+b" : "wb")))
    {
        mz_zip_writer_end(pZip);
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_OPEN_FAILED);
    }

    pZip->m_pState->m_pFile = pFile;
    pZip->m_zip_type = MZ_ZIP_TYPE_FILE;

    if (size_to_reserve_at_beginning)
    {
        mz_uint64 cur_ofs = 0;
        char buf[4096];

        MZ_CLEAR_OBJ(buf);

        do
        {
            size_t n = (size_t)MZ_MIN(sizeof(buf), size_to_reserve_at_beginning);
            if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_ofs, buf, n) != n)
            {
                mz_zip_writer_end(pZip);
                return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
            }
            cur_ofs += n;
            size_to_reserve_at_beginning -= n;
        } while (size_to_reserve_at_beginning);
    }

    return MZ_TRUE;
}